

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elsa.h
# Opt level: O2

size_t __thiscall
frozen::elsa<helics::action_message_def::action_t>::operator()
          (elsa<helics::action_message_def::action_t> *this,action_t *value,size_t seed)

{
  ulong uVar1;
  
  uVar1 = ((long)*value ^ seed) * 0x200000 + ~((long)*value ^ seed);
  uVar1 = (uVar1 >> 0x18 ^ uVar1) * 0x109;
  uVar1 = (uVar1 >> 0xe ^ uVar1) * 0x15;
  return (uVar1 >> 0x1c ^ uVar1) * 0x80000001;
}

Assistant:

constexpr std::size_t operator()(T const &value, std::size_t seed) const {
    std::size_t key = seed ^ static_cast<std::size_t>(value);
    key = (~key) + (key << 21); // key = (key << 21) - key - 1;
    key = key ^ (key >> 24);
    key = (key + (key << 3)) + (key << 8); // key * 265
    key = key ^ (key >> 14);
    key = (key + (key << 2)) + (key << 4); // key * 21
    key = key ^ (key >> 28);
    key = key + (key << 31);
    return key;
  }